

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  byte bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  AABBNodeMB4D *node1;
  ulong uVar20;
  long lVar21;
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  Primitive *prim;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24d1;
  ulong local_24d0;
  ulong local_24c8;
  RayHit *local_24c0;
  RayQueryContext *local_24b8;
  undefined1 (*local_24b0) [16];
  long local_24a8;
  undefined1 local_24a0 [32];
  undefined4 local_2480;
  undefined4 uStack_247c;
  undefined4 uStack_2478;
  undefined4 uStack_2474;
  undefined4 uStack_2470;
  undefined4 uStack_246c;
  undefined4 uStack_2468;
  undefined4 uStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return;
  }
  local_24b0 = (undefined1 (*) [16])local_2390;
  uStack_2398 = 0;
  aVar5 = (ray->super_RayK<1>).dir.field_0;
  auVar33 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar40._8_4_ = 0x7fffffff;
  auVar40._0_8_ = 0x7fffffff7fffffff;
  auVar40._12_4_ = 0x7fffffff;
  auVar40 = vandps_avx((undefined1  [16])aVar5,auVar40);
  auVar45._8_4_ = 0x219392ef;
  auVar45._0_8_ = 0x219392ef219392ef;
  auVar45._12_4_ = 0x219392ef;
  auVar40 = vcmpps_avx(auVar40,auVar45,1);
  auVar40 = vblendvps_avx((undefined1  [16])aVar5,auVar45,auVar40);
  fVar3 = (ray->super_RayK<1>).tfar;
  auVar45 = vrcpps_avx(auVar40);
  fVar9 = auVar45._0_4_;
  auVar39._0_4_ = auVar40._0_4_ * fVar9;
  fVar10 = auVar45._4_4_;
  auVar39._4_4_ = auVar40._4_4_ * fVar10;
  fVar11 = auVar45._8_4_;
  auVar39._8_4_ = auVar40._8_4_ * fVar11;
  fVar12 = auVar45._12_4_;
  auVar39._12_4_ = auVar40._12_4_ * fVar12;
  auVar50._8_4_ = 0x3f800000;
  auVar50._0_8_ = 0x3f8000003f800000;
  auVar50._12_4_ = 0x3f800000;
  auVar40 = vsubps_avx(auVar50,auVar39);
  local_2480 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  uStack_247c = local_2480;
  uStack_2478 = local_2480;
  uStack_2474 = local_2480;
  uStack_2470 = local_2480;
  uStack_246c = local_2480;
  uStack_2468 = local_2480;
  uStack_2464 = local_2480;
  uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  local_23c0._4_4_ = uVar4;
  local_23c0._0_4_ = uVar4;
  local_23c0._8_4_ = uVar4;
  local_23c0._12_4_ = uVar4;
  local_23c0._16_4_ = uVar4;
  local_23c0._20_4_ = uVar4;
  local_23c0._24_4_ = uVar4;
  local_23c0._28_4_ = uVar4;
  auVar55 = ZEXT3264(local_23c0);
  uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  local_23e0._4_4_ = uVar4;
  local_23e0._0_4_ = uVar4;
  local_23e0._8_4_ = uVar4;
  local_23e0._12_4_ = uVar4;
  local_23e0._16_4_ = uVar4;
  local_23e0._20_4_ = uVar4;
  local_23e0._24_4_ = uVar4;
  local_23e0._28_4_ = uVar4;
  auVar56 = ZEXT3264(local_23e0);
  auVar46._0_4_ = fVar9 + fVar9 * auVar40._0_4_;
  auVar46._4_4_ = fVar10 + fVar10 * auVar40._4_4_;
  auVar46._8_4_ = fVar11 + fVar11 * auVar40._8_4_;
  auVar46._12_4_ = fVar12 + fVar12 * auVar40._12_4_;
  auVar40 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar3));
  auVar44 = ZEXT1664(auVar40);
  auVar45 = vshufps_avx(auVar46,auVar46,0);
  local_2400._16_16_ = auVar45;
  local_2400._0_16_ = auVar45;
  auVar57 = ZEXT3264(local_2400);
  auVar45 = vmovshdup_avx(auVar46);
  auVar53 = ZEXT1664(auVar45);
  auVar39 = vshufps_avx(auVar46,auVar46,0x55);
  local_2420._16_16_ = auVar39;
  local_2420._0_16_ = auVar39;
  auVar58 = ZEXT3264(local_2420);
  auVar39 = vshufpd_avx(auVar46,auVar46,1);
  auVar50 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar49 = ZEXT1664(auVar50);
  local_2440._16_16_ = auVar50;
  local_2440._0_16_ = auVar50;
  auVar59 = ZEXT3264(local_2440);
  uVar28 = (ulong)(auVar46._0_4_ < 0.0) << 5;
  uVar27 = (ulong)(auVar45._0_4_ < 0.0) << 5 | 0x40;
  uVar30 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x80;
  uVar29 = uVar28 ^ 0x20;
  uVar24 = uVar27 ^ 0x20;
  auVar33 = vshufps_avx(auVar33,auVar33,0);
  local_2460._16_16_ = auVar33;
  local_2460._0_16_ = auVar33;
  auVar60 = ZEXT3264(local_2460);
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  auVar32._16_16_ = auVar40;
  auVar32._0_16_ = auVar40;
  local_24d0 = uVar27;
  local_24c8 = uVar28;
  local_24c0 = ray;
  local_24b8 = context;
  do {
    auVar36 = ZEXT464((uint)fVar3);
    auVar54 = ZEXT3264(CONCAT428(uStack_2464,
                                 CONCAT424(uStack_2468,
                                           CONCAT420(uStack_246c,
                                                     CONCAT416(uStack_2470,
                                                               CONCAT412(uStack_2474,
                                                                         CONCAT48(uStack_2478,
                                                                                  CONCAT44(
                                                  uStack_247c,local_2480))))))));
LAB_00e7e229:
    do {
      if (local_24b0 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar22 = local_24b0 + -1;
      local_24b0 = local_24b0 + -1;
    } while (auVar36._0_4_ < *(float *)(*pauVar22 + 8));
    uVar23 = *(ulong *)*local_24b0;
LAB_00e7e24d:
    if ((uVar23 & 8) == 0) {
      uVar20 = uVar23 & 0xfffffffffffffff0;
      fVar3 = (ray->super_RayK<1>).dir.field_0.m128[3];
      auVar38._4_4_ = fVar3;
      auVar38._0_4_ = fVar3;
      auVar38._8_4_ = fVar3;
      auVar38._12_4_ = fVar3;
      auVar38._16_4_ = fVar3;
      auVar38._20_4_ = fVar3;
      auVar38._24_4_ = fVar3;
      auVar38._28_4_ = fVar3;
      pfVar2 = (float *)(uVar20 + 0x100 + uVar28);
      pfVar1 = (float *)(uVar20 + 0x40 + uVar28);
      auVar35._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar35._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar35._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar35._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar35._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
      auVar35._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
      auVar35._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
      auVar35._28_4_ = auVar36._28_4_ + pfVar1[7];
      auVar35 = vsubps_avx(auVar35,auVar54._0_32_);
      auVar13._4_4_ = auVar57._4_4_ * auVar35._4_4_;
      auVar13._0_4_ = auVar57._0_4_ * auVar35._0_4_;
      auVar13._8_4_ = auVar57._8_4_ * auVar35._8_4_;
      auVar13._12_4_ = auVar57._12_4_ * auVar35._12_4_;
      auVar13._16_4_ = auVar57._16_4_ * auVar35._16_4_;
      auVar13._20_4_ = auVar57._20_4_ * auVar35._20_4_;
      auVar13._24_4_ = auVar57._24_4_ * auVar35._24_4_;
      auVar13._28_4_ = auVar35._28_4_;
      auVar35 = vmaxps_avx(auVar60._0_32_,auVar13);
      pfVar2 = (float *)(uVar20 + 0x100 + uVar27);
      pfVar1 = (float *)(uVar20 + 0x40 + uVar27);
      auVar42._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar42._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar42._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar42._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar42._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
      auVar42._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
      auVar42._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
      auVar42._28_4_ = auVar44._28_4_ + pfVar1[7];
      auVar13 = vsubps_avx(auVar42,auVar55._0_32_);
      auVar16._4_4_ = auVar58._4_4_ * auVar13._4_4_;
      auVar16._0_4_ = auVar58._0_4_ * auVar13._0_4_;
      auVar16._8_4_ = auVar58._8_4_ * auVar13._8_4_;
      auVar16._12_4_ = auVar58._12_4_ * auVar13._12_4_;
      auVar16._16_4_ = auVar58._16_4_ * auVar13._16_4_;
      auVar16._20_4_ = auVar58._20_4_ * auVar13._20_4_;
      auVar16._24_4_ = auVar58._24_4_ * auVar13._24_4_;
      auVar16._28_4_ = auVar13._28_4_;
      pfVar2 = (float *)(uVar20 + 0x100 + uVar30);
      pfVar1 = (float *)(uVar20 + 0x40 + uVar30);
      auVar47._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar47._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar47._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar47._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar47._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
      auVar47._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
      auVar47._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
      auVar47._28_4_ = auVar49._28_4_ + pfVar1[7];
      auVar14 = vsubps_avx(auVar47,auVar56._0_32_);
      auVar17._4_4_ = auVar59._4_4_ * auVar14._4_4_;
      auVar17._0_4_ = auVar59._0_4_ * auVar14._0_4_;
      auVar17._8_4_ = auVar59._8_4_ * auVar14._8_4_;
      auVar17._12_4_ = auVar59._12_4_ * auVar14._12_4_;
      auVar17._16_4_ = auVar59._16_4_ * auVar14._16_4_;
      auVar17._20_4_ = auVar59._20_4_ * auVar14._20_4_;
      auVar17._24_4_ = auVar59._24_4_ * auVar14._24_4_;
      auVar17._28_4_ = auVar14._28_4_;
      auVar13 = vmaxps_avx(auVar16,auVar17);
      local_24a0 = vmaxps_avx(auVar35,auVar13);
      pfVar2 = (float *)(uVar20 + 0x100 + uVar29);
      pfVar1 = (float *)(uVar20 + 0x40 + uVar29);
      auVar43._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar43._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar43._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar43._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar43._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
      auVar43._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
      auVar43._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
      auVar43._28_4_ = auVar13._28_4_ + pfVar1[7];
      auVar35 = vsubps_avx(auVar43,auVar54._0_32_);
      auVar18._4_4_ = auVar57._4_4_ * auVar35._4_4_;
      auVar18._0_4_ = auVar57._0_4_ * auVar35._0_4_;
      auVar18._8_4_ = auVar57._8_4_ * auVar35._8_4_;
      auVar18._12_4_ = auVar57._12_4_ * auVar35._12_4_;
      auVar18._16_4_ = auVar57._16_4_ * auVar35._16_4_;
      auVar18._20_4_ = auVar57._20_4_ * auVar35._20_4_;
      auVar18._24_4_ = auVar57._24_4_ * auVar35._24_4_;
      auVar18._28_4_ = auVar35._28_4_;
      pfVar2 = (float *)(uVar20 + 0x100 + uVar24);
      auVar35 = vminps_avx(auVar32,auVar18);
      pfVar1 = (float *)(uVar20 + 0x40 + uVar24);
      auVar48._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar48._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar48._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar48._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar48._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
      auVar48._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
      auVar48._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
      auVar48._28_4_ = auVar14._28_4_ + pfVar1[7];
      auVar13 = vsubps_avx(auVar48,auVar55._0_32_);
      pfVar2 = (float *)(uVar20 + 0x100 + (uVar30 ^ 0x20));
      pfVar1 = (float *)(uVar20 + 0x40 + (uVar30 ^ 0x20));
      auVar52._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar52._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar52._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar52._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar52._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
      auVar52._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
      auVar52._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
      auVar52._28_4_ = auVar53._28_4_ + pfVar1[7];
      auVar14._4_4_ = auVar58._4_4_ * auVar13._4_4_;
      auVar14._0_4_ = auVar58._0_4_ * auVar13._0_4_;
      auVar14._8_4_ = auVar58._8_4_ * auVar13._8_4_;
      auVar14._12_4_ = auVar58._12_4_ * auVar13._12_4_;
      auVar14._16_4_ = auVar58._16_4_ * auVar13._16_4_;
      auVar14._20_4_ = auVar58._20_4_ * auVar13._20_4_;
      auVar14._24_4_ = auVar58._24_4_ * auVar13._24_4_;
      auVar14._28_4_ = auVar13._28_4_;
      auVar13 = vsubps_avx(auVar52,auVar56._0_32_);
      auVar19._4_4_ = auVar59._4_4_ * auVar13._4_4_;
      auVar19._0_4_ = auVar59._0_4_ * auVar13._0_4_;
      auVar19._8_4_ = auVar59._8_4_ * auVar13._8_4_;
      auVar19._12_4_ = auVar59._12_4_ * auVar13._12_4_;
      auVar19._16_4_ = auVar59._16_4_ * auVar13._16_4_;
      auVar19._20_4_ = auVar59._20_4_ * auVar13._20_4_;
      auVar19._24_4_ = auVar59._24_4_ * auVar13._24_4_;
      auVar19._28_4_ = auVar13._28_4_;
      auVar53 = ZEXT3264(auVar19);
      auVar13 = vminps_avx(auVar14,auVar19);
      auVar35 = vminps_avx(auVar35,auVar13);
      auVar35 = vcmpps_avx(local_24a0,auVar35,2);
      if (((uint)uVar23 & 7) == 6) {
        auVar13 = vcmpps_avx(*(undefined1 (*) [32])(uVar20 + 0x1c0),auVar38,2);
        auVar14 = vcmpps_avx(auVar38,*(undefined1 (*) [32])(uVar20 + 0x1e0),1);
        auVar14 = vandps_avx(auVar13,auVar14);
        auVar35 = vandps_avx(auVar14,auVar35);
        auVar40 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
      }
      else {
        auVar40 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
      }
      auVar49 = ZEXT3264(auVar13);
      auVar40 = vpsllw_avx(auVar40,0xf);
      auVar44 = ZEXT1664(auVar40);
      if ((((((((auVar40 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar40 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar40 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar40 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar40[0xf] < '\0'
         ) {
        auVar40 = vpacksswb_avx(auVar40,auVar40);
        auVar36 = ZEXT1664(auVar40);
        bVar15 = SUB161(auVar40 >> 7,0) & 1 | (SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar40 >> 0x17,0) & 1) << 2 | (SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar40 >> 0x27,0) & 1) << 4 | (SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar40 >> 0x37,0) & 1) << 6 | SUB161(auVar40 >> 0x3f,0) << 7;
        lVar21 = 0;
        if (bVar15 != 0) {
          for (; (bVar15 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
        uVar23 = *(ulong *)(uVar20 + lVar21 * 8);
        uVar26 = bVar15 - 1 & (uint)bVar15;
        if (uVar26 != 0) {
          uVar6 = *(uint *)(local_24a0 + lVar21 * 4);
          lVar21 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar8 = *(ulong *)(uVar20 + lVar21 * 8);
          uVar7 = *(uint *)(local_24a0 + lVar21 * 4);
          uVar26 = uVar26 - 1 & uVar26;
          uVar27 = local_24d0;
          if (uVar26 == 0) {
            if (uVar6 < uVar7) {
              *(ulong *)*local_24b0 = uVar8;
              *(uint *)(*local_24b0 + 8) = uVar7;
              local_24b0 = local_24b0 + 1;
            }
            else {
              *(ulong *)*local_24b0 = uVar23;
              *(uint *)(*local_24b0 + 8) = uVar6;
              local_24b0 = local_24b0 + 1;
              uVar23 = uVar8;
            }
          }
          else {
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar23;
            auVar40 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar6));
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar8;
            auVar33 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar7));
            lVar21 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            auVar41._8_8_ = 0;
            auVar41._0_8_ = *(ulong *)(uVar20 + lVar21 * 8);
            auVar45 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_24a0 + lVar21 * 4)));
            auVar39 = vpcmpgtd_avx(auVar33,auVar40);
            uVar26 = uVar26 - 1 & uVar26;
            if (uVar26 == 0) {
              auVar50 = vpshufd_avx(auVar39,0xaa);
              auVar39 = vblendvps_avx(auVar33,auVar40,auVar50);
              auVar40 = vblendvps_avx(auVar40,auVar33,auVar50);
              auVar33 = vpcmpgtd_avx(auVar45,auVar39);
              auVar50 = vpshufd_avx(auVar33,0xaa);
              auVar33 = vblendvps_avx(auVar45,auVar39,auVar50);
              auVar49 = ZEXT1664(auVar33);
              auVar45 = vblendvps_avx(auVar39,auVar45,auVar50);
              auVar39 = vpcmpgtd_avx(auVar45,auVar40);
              auVar50 = vpshufd_avx(auVar39,0xaa);
              auVar44 = ZEXT1664(auVar50);
              auVar39 = vblendvps_avx(auVar45,auVar40,auVar50);
              auVar53 = ZEXT1664(auVar39);
              auVar40 = vblendvps_avx(auVar40,auVar45,auVar50);
              auVar36 = ZEXT1664(auVar40);
              *local_24b0 = auVar40;
              local_24b0[1] = auVar39;
              uVar23 = auVar33._0_8_;
              local_24b0 = local_24b0 + 2;
            }
            else {
              lVar21 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              auVar51._8_8_ = 0;
              auVar51._0_8_ = *(ulong *)(uVar20 + lVar21 * 8);
              auVar50 = vpunpcklqdq_avx(auVar51,ZEXT416(*(uint *)(local_24a0 + lVar21 * 4)));
              uVar26 = uVar26 - 1 & uVar26;
              uVar23 = (ulong)uVar26;
              if (uVar26 == 0) {
                auVar46 = vpshufd_avx(auVar39,0xaa);
                auVar39 = vblendvps_avx(auVar33,auVar40,auVar46);
                auVar40 = vblendvps_avx(auVar40,auVar33,auVar46);
                auVar33 = vpcmpgtd_avx(auVar50,auVar45);
                auVar46 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar50,auVar45,auVar46);
                auVar45 = vblendvps_avx(auVar45,auVar50,auVar46);
                auVar50 = vpcmpgtd_avx(auVar45,auVar40);
                auVar46 = vpshufd_avx(auVar50,0xaa);
                auVar50 = vblendvps_avx(auVar45,auVar40,auVar46);
                auVar40 = vblendvps_avx(auVar40,auVar45,auVar46);
                auVar45 = vpcmpgtd_avx(auVar33,auVar39);
                auVar46 = vpshufd_avx(auVar45,0xaa);
                auVar45 = vblendvps_avx(auVar33,auVar39,auVar46);
                auVar33 = vblendvps_avx(auVar39,auVar33,auVar46);
                auVar39 = vpcmpgtd_avx(auVar50,auVar33);
                auVar39 = vpshufd_avx(auVar39,0xaa);
                auVar46 = vblendvps_avx(auVar50,auVar33,auVar39);
                auVar33 = vblendvps_avx(auVar33,auVar50,auVar39);
                *local_24b0 = auVar40;
                local_24b0[1] = auVar33;
                local_24b0[2] = auVar46;
                uVar23 = auVar45._0_8_;
                pauVar22 = local_24b0 + 3;
              }
              else {
                *local_24b0 = auVar40;
                local_24b0[1] = auVar33;
                local_24b0[2] = auVar45;
                pauVar22 = local_24b0 + 3;
                local_24b0[3] = auVar50;
                do {
                  lVar21 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                    }
                  }
                  auVar34._8_8_ = 0;
                  auVar34._0_8_ = *(ulong *)(uVar20 + lVar21 * 8);
                  auVar40 = vpunpcklqdq_avx(auVar34,ZEXT416(*(uint *)(local_24a0 + lVar21 * 4)));
                  pauVar22[1] = auVar40;
                  pauVar22 = pauVar22 + 1;
                  uVar23 = uVar23 & uVar23 - 1;
                } while (uVar23 != 0);
                lVar21 = 0;
                while (pauVar22 != local_24b0) {
                  auVar40 = local_24b0[1];
                  uVar26 = vextractps_avx(auVar40,2);
                  for (lVar25 = 0x10;
                      (lVar21 != lVar25 && (*(uint *)(local_24b0[-1] + lVar25 + 8) < uVar26));
                      lVar25 = lVar25 + -0x10) {
                    *(undefined1 (*) [16])(*local_24b0 + lVar25) =
                         *(undefined1 (*) [16])(local_24b0[-1] + lVar25);
                  }
                  *(undefined1 (*) [16])(*local_24b0 + lVar25) = auVar40;
                  lVar21 = lVar21 + -0x10;
                  local_24b0 = local_24b0 + 1;
                }
                uVar23 = *(ulong *)*pauVar22;
              }
              auVar36 = ZEXT1664(auVar40);
              auVar53 = ZEXT1664(auVar50);
              auVar49 = ZEXT1664(auVar39);
              auVar44 = ZEXT1664(auVar45);
              auVar54 = ZEXT3264(CONCAT428(uStack_2464,
                                           CONCAT424(uStack_2468,
                                                     CONCAT420(uStack_246c,
                                                               CONCAT416(uStack_2470,
                                                                         CONCAT412(uStack_2474,
                                                                                   CONCAT48(
                                                  uStack_2478,CONCAT44(uStack_247c,local_2480)))))))
                                );
              local_24b0 = pauVar22;
            }
          }
        }
        goto LAB_00e7e24d;
      }
      auVar40 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                       ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
      auVar36 = ZEXT1664(auVar40);
      goto LAB_00e7e229;
    }
    local_24a8 = (ulong)((uint)uVar23 & 0xf) - 8;
    prim = (Primitive *)(uVar23 & 0xfffffffffffffff0);
    while (bVar31 = local_24a8 != 0, local_24a8 = local_24a8 + -1, bVar31) {
      auVar44 = ZEXT1664(auVar44._0_16_);
      auVar49 = ZEXT1664(auVar49._0_16_);
      auVar53 = ZEXT1664(auVar53._0_16_);
      InstanceArrayIntersector1MB::intersect(&local_24d1,ray,local_24b8,prim);
      auVar60 = ZEXT3264(local_2460);
      auVar59 = ZEXT3264(local_2440);
      auVar58 = ZEXT3264(local_2420);
      auVar57 = ZEXT3264(local_2400);
      auVar56 = ZEXT3264(local_23e0);
      auVar55 = ZEXT3264(local_23c0);
      prim = prim + 1;
      ray = local_24c0;
      uVar27 = local_24d0;
      uVar28 = local_24c8;
    }
    fVar3 = (ray->super_RayK<1>).tfar;
    auVar32._4_4_ = fVar3;
    auVar32._0_4_ = fVar3;
    auVar32._8_4_ = fVar3;
    auVar32._12_4_ = fVar3;
    auVar32._16_4_ = fVar3;
    auVar32._20_4_ = fVar3;
    auVar32._24_4_ = fVar3;
    auVar32._28_4_ = fVar3;
    fVar3 = (ray->super_RayK<1>).tfar;
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }